

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bison.cpp
# Opt level: O2

int yyparse(CProgram **program)

{
  size_t __n;
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  byte *pbVar6;
  char *s;
  YYSTYPE this;
  int iVar7;
  yysymbol_kind_t yVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  YYSTYPE *__dest;
  YYSTYPE *pYVar12;
  CProgram **ppCVar13;
  CProgram **program_00;
  byte *pbVar14;
  long lVar15;
  YYSTYPE *pYVar16;
  YYSTYPE *__dest_00;
  ulong uVar17;
  byte *__src;
  bool bVar18;
  undefined8 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  char *yymsg;
  long yymsg_alloc;
  YYSTYPE *local_1478;
  YYSTYPE *local_1470;
  YYSTYPE *local_1468;
  yypcontext_t yyctx;
  char yymsgbuf [128];
  yy_state_t yyssa [200];
  YYSTYPE yyvsa [200];
  YYLTYPE yylsa [200];
  
  yymsg = yymsgbuf;
  yymsg_alloc = 0x80;
  yychar = -2;
  yylsa[0].first_column = yylloc.first_column;
  yylsa[0].first_line = yylloc.first_line;
  yylsa[0].last_line = yylloc.last_line;
  yylsa[0].last_column = yylloc.last_column;
  pYVar16 = (YYSTYPE *)yylsa;
  pbVar14 = yyssa;
  pYVar12 = yyvsa;
  iVar5 = 0;
  uVar10 = 0;
  program_00 = (CProgram **)0xc8;
  __src = pbVar14;
  local_1478 = pYVar12;
  local_1470 = pYVar16;
  local_1468 = (YYSTYPE *)program;
  do {
    *pbVar14 = (byte)uVar10;
    ppCVar13 = program_00;
    if (__src + (long)program_00 + -1 <= pbVar14) {
      if ((long)program_00 < 10000) {
        ppCVar13 = (CProgram **)((long)program_00 * 2);
        if (9999 < (long)ppCVar13) {
          ppCVar13 = (CProgram **)0x2710;
        }
        program_00 = (CProgram **)((long)ppCVar13 * 0x19 + 0x1e);
        pbVar6 = (byte *)malloc((size_t)program_00);
        if (pbVar6 != (byte *)0x0) {
          lVar15 = (long)pbVar14 - (long)__src;
          __n = lVar15 + 1;
          memcpy(pbVar6,__src,__n);
          __dest_00 = (YYSTYPE *)(pbVar6 + (((long)ppCVar13 + 0xf) / 0x10) * 0x10);
          memcpy(__dest_00,local_1478,__n * 8);
          __dest = __dest_00 + (((long)ppCVar13 * 8 + 0xf) / 0x10) * 2;
          memcpy(__dest,local_1470,__n * 0x10);
          if (__src != yyssa) {
            free(__src);
          }
          if ((long)__n < (long)ppCVar13) {
            pbVar14 = pbVar6 + lVar15;
            pYVar12 = __dest_00 + lVar15;
            pYVar16 = __dest + __n * 2 + -2;
            __src = pbVar6;
            local_1478 = __dest_00;
            local_1470 = __dest;
            goto LAB_0014bc1b;
          }
          iVar5 = 1;
          goto LAB_0014c880;
        }
      }
LAB_0014c8be:
      yyerror(program_00,"memory exhausted");
      iVar5 = 2;
      goto LAB_0014c870;
    }
LAB_0014bc1b:
    if (uVar10 == 6) {
      iVar5 = 0;
      goto LAB_0014c870;
    }
    uVar11 = (uint)yypact[uVar10];
    if (uVar11 != 0xffffff8a) {
      if (yychar == -2) {
        yychar = yylex();
      }
      if (0 < yychar) {
        if (yychar != 0x100) {
          iVar7 = 2;
          if ((uint)yychar < 300) {
            iVar7 = (int)""[(uint)yychar];
          }
          goto LAB_0014bcc3;
        }
        yychar = 0x101;
        uVar19 = CONCAT44(yylloc.first_column,yylloc.first_line);
        goto LAB_0014bf07;
      }
      yychar = 0;
      iVar7 = 0;
LAB_0014bcc3:
      uVar4 = iVar7 + uVar11;
      if ((0x144 < uVar4) || (iVar7 != yycheck[uVar4])) goto LAB_0014bd33;
      uVar10 = (uint)yytable[uVar4];
      if (yytable[uVar4] == 0) {
        iVar7 = 0;
        goto LAB_0014bd43;
      }
      bVar18 = iVar5 == 0;
      iVar5 = iVar5 + -1;
      if (bVar18) {
        iVar5 = 0;
      }
      pYVar12[1] = yylval;
      pYVar12 = pYVar12 + 1;
      auVar1._4_4_ = yylloc.first_column;
      auVar1._0_4_ = yylloc.first_line;
      auVar1._8_4_ = yylloc.last_line;
      auVar1._12_4_ = yylloc.last_column;
      *(undefined1 (*) [16])(pYVar16 + 2) = auVar1;
      pYVar16 = pYVar16 + 2;
      yychar = -2;
      goto LAB_0014c82d;
    }
LAB_0014bd33:
    iVar7 = (int)""[uVar10];
    if (""[uVar10] == '\0') {
      uVar17 = (ulong)(uint)yychar;
      yVar8 = YYSYMBOL_YYEMPTY;
      if ((uVar17 != 0xfffffffe) && (yVar8 = YYSYMBOL_YYUNDEF, (uint)yychar < 300)) {
        yVar8 = (yysymbol_kind_t)""[uVar17];
      }
      if (iVar5 == 0) {
        yynerrs = yynerrs + 1;
        yyctx.yylloc = &yylloc;
        program_00 = (CProgram **)&yymsg_alloc;
        yyctx.yyssp = pbVar14;
        yyctx.yytoken = yVar8;
        iVar5 = yysyntax_error((long *)program_00,&yymsg,&yyctx);
        if (iVar5 == -1) {
          if (yymsg != yymsgbuf) {
            free(yymsg);
          }
          program_00 = (CProgram **)yymsg_alloc;
          s = (char *)malloc(yymsg_alloc);
          if (s == (char *)0x0) {
            yymsg = yymsgbuf;
            yymsg_alloc = 0x80;
            s = "syntax error";
            iVar5 = -2;
          }
          else {
            program_00 = (CProgram **)&yymsg_alloc;
            yymsg = s;
            iVar5 = yysyntax_error((long *)program_00,&yymsg,&yyctx);
          }
        }
        else {
          s = "syntax error";
          if (iVar5 == 0) {
            iVar5 = 0;
            s = yymsg;
          }
        }
        yyerror(program_00,s);
        if (iVar5 == -2) goto LAB_0014c8be;
        uVar19 = CONCAT44(yylloc.first_column,yylloc.first_line);
      }
      else {
        uVar19 = CONCAT44(yylloc.first_column,yylloc.first_line);
        if (iVar5 == 3) {
          if (yychar < 1) {
            if (uVar17 == 0) {
LAB_0014c86d:
              iVar5 = 1;
LAB_0014c870:
              pbVar6 = __src;
              if (__src != yyssa) {
LAB_0014c880:
                free(pbVar6);
              }
              if (yymsg != yymsgbuf) {
                free(yymsg);
              }
              return iVar5;
            }
          }
          else {
            yychar = -2;
          }
        }
      }
LAB_0014bf07:
      lVar15 = -0x10;
      lVar9 = 0;
      while ((short)uVar11 != -1) {
        if (pbVar14 == __src) goto LAB_0014c86d;
        uVar19 = *(undefined8 *)((long)pYVar16 + lVar9 * 2);
        pbVar6 = pbVar14 + -1;
        pbVar14 = pbVar14 + -1;
        lVar9 = lVar9 + -8;
        lVar15 = lVar15 + 0x10;
        uVar11 = (uint)(ushort)yypact[*pbVar6];
      }
      pYVar12 = (YYSTYPE *)((long)pYVar12 + lVar9 + 8);
      *pYVar12 = yylval;
      *(undefined8 *)((long)pYVar16 + lVar9 * 2 + 0x10) = uVar19;
      *(ulong *)((long)pYVar16 + lVar9 * 2 + 0x18) = CONCAT44(yylloc.last_column,yylloc.last_line);
      pYVar16 = (YYSTYPE *)((long)pYVar16 - lVar15);
      uVar10 = 5;
      iVar5 = 3;
      goto LAB_0014c82d;
    }
LAB_0014bd43:
    uVar17 = (ulong)iVar7;
    lVar15 = (long)""[uVar17];
    if ((0x200000002804821U >> (uVar17 & 0x3f) & 1) == 0) {
      uVar20 = *(undefined4 *)(pYVar16 + lVar15 * -2 + 2);
      uVar21 = *(undefined4 *)((long)(pYVar16 + lVar15 * -2 + 2) + 4);
      uVar22 = *(undefined4 *)(pYVar16 + 2);
      uVar23 = *(undefined4 *)((long)pYVar16 + 0x14);
    }
    else {
      uVar20 = *(undefined4 *)(pYVar16 + 1);
      uVar21 = *(undefined4 *)((long)pYVar16 + 0xc);
      uVar22 = uVar20;
      uVar23 = uVar21;
    }
    switch(iVar7) {
    case 2:
      this.Program = (CProgram *)operator_new(0x28);
      CProgram::CProgram(this.Program,pYVar12[-1].MainClass,pYVar12->ClassDeclarationList);
      local_1468->Program = (CProgram *)this;
      break;
    case 3:
      this.Program = (CProgram *)operator_new(0x28);
      CMainClass::CMainClass(this.MainClass,pYVar12[-3].Identifier,pYVar12[-1].MainMethod);
      break;
    case 4:
      this.Program = (CProgram *)operator_new(0x38);
      CMainMethod::CMainMethod
                (this.MainMethod,(CType *)0x0,pYVar12[-5].Identifier,pYVar12[-2].VarDeclarationList,
                 (CCompoundStm *)pYVar12[-1].Program);
      break;
    case 5:
      this.Program = (CProgram *)operator_new(0x30);
      CClassList::CClassList(this.ClassDeclarationList);
      break;
    case 6:
      this = (YYSTYPE)pYVar12[-1].ClassDeclarationList;
      CClassList::Add(this.ClassDeclarationList,pYVar12->Class);
      break;
    case 7:
      this.Program = (CProgram *)operator_new(0x38);
      CClass::CClass(this.Class,pYVar12[-4].Identifier,(CIdExp *)0x0,pYVar12[-2].VarDeclarationList,
                     pYVar12[-1].MethodDeclarationList);
      break;
    case 8:
      this.Program = (CProgram *)operator_new(0x38);
      CClass::CClass(this.Class,pYVar12[-6].Identifier,pYVar12[-4].Identifier,
                     pYVar12[-2].VarDeclarationList,pYVar12[-1].MethodDeclarationList);
      break;
    case 9:
      this.Program = (CProgram *)operator_new(0x50);
      CMethod::CMethod(this.MethodDeclaration,pYVar12[-0xb].Type,pYVar12[-2].Expression,
                       pYVar12[-10].Identifier,pYVar12[-8].ArgumentList,
                       pYVar12[-5].VarDeclarationList,(CCompoundStm *)pYVar12[-4].Program,true);
      break;
    case 10:
      this.Program = (CProgram *)operator_new(0x50);
      CMethod::CMethod(this.MethodDeclaration,pYVar12[-0xb].Type,pYVar12[-2].Expression,
                       pYVar12[-10].Identifier,pYVar12[-8].ArgumentList,
                       pYVar12[-5].VarDeclarationList,(CCompoundStm *)pYVar12[-4].Program,false);
      break;
    case 0xb:
      this.Program = (CProgram *)operator_new(0x30);
      CMethodList::CMethodList(this.MethodDeclarationList);
      break;
    case 0xc:
      this = (YYSTYPE)pYVar12[-1].MethodDeclarationList;
      CMethodList::Add(this.MethodDeclarationList,pYVar12->MethodDeclaration);
      break;
    case 0xd:
      (pYVar12[-1].Identifier)->isInstance = true;
      this.Program = (CProgram *)operator_new(0x28);
      CField::CField(this.VarDeclaration,pYVar12[-2].Type,pYVar12[-1].Identifier);
      break;
    case 0xe:
      this.Program = (CProgram *)operator_new(0x30);
      CFieldList::CFieldList(this.VarDeclarationList);
      break;
    case 0xf:
      this = (YYSTYPE)pYVar12[-1].VarDeclarationList;
      CFieldList::Add(this.VarDeclarationList,pYVar12->VarDeclaration);
      break;
    case 0x10:
      pYVar12->Identifier->isInstance = true;
      this.Program = (CProgram *)operator_new(0x28);
      CArgument::CArgument(this.Argument,pYVar12[-1].Type,pYVar12->Identifier);
      break;
    case 0x11:
      this.Program = (CProgram *)operator_new(0x28);
      CType::CType(this.Type,INT_ARRAY);
      goto LAB_0014c781;
    case 0x12:
      this.Program = (CProgram *)operator_new(0x28);
      CType::CType(this.Type,BOOLEAN);
      goto LAB_0014c781;
    case 0x13:
      this.Program = (CProgram *)operator_new(0x28);
      CType::CType(this.Type,INT);
      goto LAB_0014c781;
    case 0x14:
      this.Program = (CProgram *)operator_new(0x28);
      CType::CType(this.Type,pYVar12->Identifier);
      break;
    case 0x15:
      this.Program = (CProgram *)operator_new(0x30);
      CArgumentList::CArgumentList(this.ArgumentList,pYVar12->Argument);
      break;
    case 0x16:
      this = (YYSTYPE)pYVar12[-2].ArgumentList;
      CArgumentList::Add(this.ArgumentList,pYVar12->Argument);
      break;
    case 0x17:
      this.Program = (CProgram *)operator_new(0x30);
      CArgumentList::CArgumentList(this.ArgumentList);
      break;
    case 0x19:
      this.Program = (CProgram *)operator_new(0x28);
      CCompoundStm::CCompoundStm((CCompoundStm *)this.Program,(IStatement *)0x0,(IStatement *)0x0);
      break;
    case 0x1a:
      this.Program = (CProgram *)operator_new(0x28);
      CCompoundStm::CCompoundStm
                ((CCompoundStm *)this.Program,pYVar12[-1].Statement,pYVar12->Statement);
      break;
    case 0x1b:
    case 0x34:
      this = pYVar12[-1];
      break;
    case 0x1c:
      this.Program = (CProgram *)operator_new(0x30);
      CIfStm::CIfStm((CIfStm *)this.Program,pYVar12[-4].Expression,pYVar12[-2].Statement,
                     pYVar12->Statement);
      break;
    case 0x1d:
      this.Program = (CProgram *)operator_new(0x28);
      CWhileStm::CWhileStm((CWhileStm *)this.Program,pYVar12[-2].Expression,pYVar12->Statement);
      break;
    case 0x1e:
      this.Program = (CProgram *)operator_new(0x20);
      CPrintStm::CPrintStm((CPrintStm *)this.Program,pYVar12[-2].Expression);
      break;
    case 0x1f:
      (pYVar12[-3].Identifier)->isInstance = true;
      this.Program = (CProgram *)operator_new(0x28);
      CAssignStm::CAssignStm
                ((CAssignStm *)this.Program,pYVar12[-3].Identifier,pYVar12[-1].Expression);
      break;
    case 0x20:
      (pYVar12[-6].Identifier)->isInstance = true;
      this.Program = (CProgram *)operator_new(0x30);
      CAssignSubscriptStm::CAssignSubscriptStm
                ((CAssignSubscriptStm *)this.Program,pYVar12[-6].Identifier,pYVar12[-4].Expression,
                 pYVar12[-1].Expression);
      break;
    case 0x21:
      this.Program = (CProgram *)operator_new(0x30);
      COpExp::COpExp((COpExp *)this.Program,pYVar12[-2].Expression,pYVar12->Expression,PLUS);
      break;
    case 0x22:
      this.Program = (CProgram *)operator_new(0x30);
      COpExp::COpExp((COpExp *)this.Program,pYVar12[-2].Expression,pYVar12->Expression,MINUS);
      break;
    case 0x23:
      this.Program = (CProgram *)operator_new(0x30);
      COpExp::COpExp((COpExp *)this.Program,pYVar12[-2].Expression,pYVar12->Expression,MULTIPLY);
      break;
    case 0x24:
      this.Program = (CProgram *)operator_new(0x30);
      CLogOpExp::CLogOpExp((CLogOpExp *)this.Program,pYVar12[-2].Expression,pYVar12->Expression,AND)
      ;
      break;
    case 0x25:
      this.Program = (CProgram *)operator_new(0x30);
      CLogOpExp::CLogOpExp((CLogOpExp *)this.Program,pYVar12[-2].Expression,pYVar12->Expression,OR);
      break;
    case 0x26:
      this.Program = (CProgram *)operator_new(0x30);
      CCompExp::CCompExp((CCompExp *)this.Program,pYVar12[-2].Expression,pYVar12->Expression,LESS);
      break;
    case 0x27:
      this.Program = (CProgram *)operator_new(0x30);
      CCompExp::CCompExp((CCompExp *)this.Program,pYVar12[-2].Expression,pYVar12->Expression,GREATER
                        );
      break;
    case 0x28:
      this.Program = (CProgram *)operator_new(0x30);
      COpExp::COpExp((COpExp *)this.Program,pYVar12[-2].Expression,pYVar12->Expression,MOD);
      break;
    case 0x29:
      this.Program = (CProgram *)operator_new(0x28);
      CByIndexExpression::CByIndexExpression
                ((CByIndexExpression *)this.Program,pYVar12[-3].Expression,pYVar12[-1].Expression);
      break;
    case 0x2a:
      this.Program = (CProgram *)operator_new(0x20);
      CGetLengthExp::CGetLengthExp((CGetLengthExp *)this.Program,pYVar12[-2].Expression);
      break;
    case 0x2b:
      this.Program = (CProgram *)operator_new(0x30);
      CCallMethodExp::CCallMethodExp
                ((CCallMethodExp *)this.Program,pYVar12[-5].Expression,pYVar12[-3].Identifier,
                 pYVar12[-1].ExpressionList);
      break;
    case 0x2c:
      pYVar12->Identifier->isInstance = true;
      this.Program = (CProgram *)operator_new(0x20);
      CGetFieldByThisExpression::CGetFieldByThisExpression
                ((CGetFieldByThisExpression *)this.Program,pYVar12->Identifier);
      break;
    case 0x2d:
      this.Program = (CProgram *)operator_new(0x20);
      CUnarMinusExp::CUnarMinusExp((CUnarMinusExp *)this.Program,pYVar12->Expression);
      break;
    case 0x2e:
      this.Program = (CProgram *)operator_new(0x20);
      CNumExp::CNumExp((CNumExp *)this.Program,pYVar12->string);
      goto LAB_0014c781;
    case 0x2f:
      this.Program = (CProgram *)operator_new(0x20);
      CLogExp::CLogExp((CLogExp *)this.Program,true);
      goto LAB_0014c781;
    case 0x30:
      this.Program = (CProgram *)operator_new(0x20);
      CLogExp::CLogExp((CLogExp *)this.Program,false);
      goto LAB_0014c781;
    case 0x31:
      pYVar12->Identifier->isInstance = true;
    case 0x18:
    case 0x3a:
      this = *pYVar12;
      break;
    case 0x32:
      this.Program = (CProgram *)operator_new(0x20);
      CNewArrayExpression::CNewArrayExpression
                ((CNewArrayExpression *)this.Program,pYVar12[-1].Expression);
      break;
    case 0x33:
      this.Program = (CProgram *)operator_new(0x20);
      CNewIdentifier::CNewIdentifier((CNewIdentifier *)this.Program,pYVar12[-2].Identifier);
      break;
    case 0x35:
      this.Program = (CProgram *)operator_new(0x18);
      CThisExpression::CThisExpression((CThisExpression *)this.Program);
      goto LAB_0014c781;
    case 0x36:
      this.Program = (CProgram *)operator_new(0x20);
      CNegativeExpression::CNegativeExpression
                ((CNegativeExpression *)this.Program,pYVar12->Expression);
      break;
    case 0x37:
      this.Program = (CProgram *)operator_new(0x30);
      CExpList::CExpList(this.ExpressionList,pYVar12->Expression);
      break;
    case 0x38:
      this = (YYSTYPE)pYVar12[-2].ExpressionList;
      CExpList::Add(this.ExpressionList,pYVar12->Expression);
      break;
    case 0x39:
      this.Program = (CProgram *)operator_new(0x30);
      CExpList::CExpList(this.ExpressionList);
      break;
    case 0x3b:
      this.Program = (CProgram *)operator_new(0x40);
      CIdExp::CIdExp(this.Identifier,pYVar12->string);
LAB_0014c781:
      iVar3 = yylloc.last_column;
      iVar2 = yylloc.last_line;
      iVar7 = yylloc.first_column;
      ((this.Program)->super_IWrapper).super_PositionedNode.position.firstLine = yylloc.first_line;
      ((this.Program)->super_IWrapper).super_PositionedNode.position.lastLine = iVar2;
      ((this.Program)->super_IWrapper).super_PositionedNode.position.firstColumn = iVar7;
      ((this.Program)->super_IWrapper).super_PositionedNode.position.lastColumn = iVar3;
      break;
    default:
      this = pYVar12[1 - lVar15];
    }
    pbVar14 = pbVar14 + -lVar15;
    pYVar12[1 - lVar15] = this;
    *(undefined4 *)(pYVar16 + lVar15 * -2 + 2) = uVar20;
    *(undefined4 *)((long)pYVar16 + lVar15 * -0x10 + 0x14) = uVar21;
    *(undefined4 *)(pYVar16 + lVar15 * -2 + 3) = uVar22;
    *(undefined4 *)((long)pYVar16 + lVar15 * -0x10 + 0x1c) = uVar23;
    uVar10 = (int)*(short *)("" + (long)""[uVar17] * 2 + 0x26) + (uint)*pbVar14;
    if ((uVar10 < 0x145) && ((int)yycheck[uVar10] == (uint)*pbVar14)) {
      pbVar6 = yytable + uVar10;
    }
    else {
      pbVar6 = (byte *)((long)yypgoto + (long)""[uVar17] + 3);
    }
    pYVar12 = pYVar12 + (1 - lVar15);
    pYVar16 = pYVar16 + lVar15 * -2 + 2;
    uVar10 = (uint)*pbVar6;
LAB_0014c82d:
    pbVar14 = pbVar14 + 1;
    program_00 = ppCVar13;
  } while( true );
}

Assistant:

int
yyparse (CProgram** program)
{
    yy_state_fast_t yystate = 0;
    /* Number of tokens to shift before error messages enabled.  */
    int yyerrstatus = 0;

    /* Refer to the stacks through separate pointers, to allow yyoverflow
       to reallocate them elsewhere.  */

    /* Their size.  */
    YYPTRDIFF_T yystacksize = YYINITDEPTH;

    /* The state stack: array, bottom, top.  */
    yy_state_t yyssa[YYINITDEPTH];
    yy_state_t *yyss = yyssa;
    yy_state_t *yyssp = yyss;

    /* The semantic value stack: array, bottom, top.  */
    YYSTYPE yyvsa[YYINITDEPTH];
    YYSTYPE *yyvs = yyvsa;
    YYSTYPE *yyvsp = yyvs;

    /* The location stack: array, bottom, top.  */
    YYLTYPE yylsa[YYINITDEPTH];
    YYLTYPE *yyls = yylsa;
    YYLTYPE *yylsp = yyls;

  int yyn;
  /* The return value of yyparse.  */
  int yyresult;
  /* Lookahead symbol kind.  */
  yysymbol_kind_t yytoken = YYSYMBOL_YYEMPTY;
  /* The variables used to return semantic value and location from the
     action routines.  */
  YYSTYPE yyval;
  YYLTYPE yyloc;

  /* The locations where the error started and ended.  */
  YYLTYPE yyerror_range[3];

  /* Buffer for error messages, and its allocated size.  */
  char yymsgbuf[128];
  char *yymsg = yymsgbuf;
  YYPTRDIFF_T yymsg_alloc = sizeof yymsgbuf;

#define YYPOPSTACK(N)   (yyvsp -= (N), yyssp -= (N), yylsp -= (N))

  /* The number of symbols on the RHS of the reduced rule.
     Keep to zero when no symbol should be popped.  */
  int yylen = 0;

  YYDPRINTF ((stderr, "Starting parse\n"));

  yychar = YYEMPTY; /* Cause a token to be read.  */

  yylsp[0] = yylloc;
  goto yysetstate;


/*------------------------------------------------------------.
| yynewstate -- push a new state, which is found in yystate.  |
`------------------------------------------------------------*/
yynewstate:
  /* In all cases, when you get here, the value and location stacks
     have just been pushed.  So pushing a state here evens the stacks.  */
  yyssp++;


/*--------------------------------------------------------------------.
| yysetstate -- set current state (the top of the stack) to yystate.  |
`--------------------------------------------------------------------*/
yysetstate:
  YYDPRINTF ((stderr, "Entering state %d\n", yystate));
  YY_ASSERT (0 <= yystate && yystate < YYNSTATES);
  YY_IGNORE_USELESS_CAST_BEGIN
  *yyssp = YY_CAST (yy_state_t, yystate);
  YY_IGNORE_USELESS_CAST_END
  YY_STACK_PRINT (yyss, yyssp);

  if (yyss + yystacksize - 1 <= yyssp)
#if !defined yyoverflow && !defined YYSTACK_RELOCATE
    YYNOMEM;
#else
    {
      /* Get the current used size of the three stacks, in elements.  */
      YYPTRDIFF_T yysize = yyssp - yyss + 1;

# if defined yyoverflow
      {
        /* Give user a chance to reallocate the stack.  Use copies of
           these so that the &'s don't force the real ones into
           memory.  */
        yy_state_t *yyss1 = yyss;
        YYSTYPE *yyvs1 = yyvs;
        YYLTYPE *yyls1 = yyls;

        /* Each stack pointer address is followed by the size of the
           data in use in that stack, in bytes.  This used to be a
           conditional around just the two extra args, but that might
           be undefined if yyoverflow is a macro.  */
        yyoverflow (YY_("memory exhausted"),
                    &yyss1, yysize * YYSIZEOF (*yyssp),
                    &yyvs1, yysize * YYSIZEOF (*yyvsp),
                    &yyls1, yysize * YYSIZEOF (*yylsp),
                    &yystacksize);
        yyss = yyss1;
        yyvs = yyvs1;
        yyls = yyls1;
      }
# else /* defined YYSTACK_RELOCATE */
      /* Extend the stack our own way.  */
      if (YYMAXDEPTH <= yystacksize)
        YYNOMEM;
      yystacksize *= 2;
      if (YYMAXDEPTH < yystacksize)
        yystacksize = YYMAXDEPTH;

      {
        yy_state_t *yyss1 = yyss;
        union yyalloc *yyptr =
          YY_CAST (union yyalloc *,
                   YYSTACK_ALLOC (YY_CAST (YYSIZE_T, YYSTACK_BYTES (yystacksize))));
        if (! yyptr)
          YYNOMEM;
        YYSTACK_RELOCATE (yyss_alloc, yyss);
        YYSTACK_RELOCATE (yyvs_alloc, yyvs);
        YYSTACK_RELOCATE (yyls_alloc, yyls);
#  undef YYSTACK_RELOCATE
        if (yyss1 != yyssa)
          YYSTACK_FREE (yyss1);
      }
# endif

      yyssp = yyss + yysize - 1;
      yyvsp = yyvs + yysize - 1;
      yylsp = yyls + yysize - 1;

      YY_IGNORE_USELESS_CAST_BEGIN
      YYDPRINTF ((stderr, "Stack size increased to %ld\n",
                  YY_CAST (long, yystacksize)));
      YY_IGNORE_USELESS_CAST_END

      if (yyss + yystacksize - 1 <= yyssp)
        YYABORT;
    }
#endif /* !defined yyoverflow && !defined YYSTACK_RELOCATE */


  if (yystate == YYFINAL)
    YYACCEPT;

  goto yybackup;


/*-----------.
| yybackup.  |
`-----------*/
yybackup:
  /* Do appropriate processing given the current state.  Read a
     lookahead token if we need one and don't already have one.  */

  /* First try to decide what to do without reference to lookahead token.  */
  yyn = yypact[yystate];
  if (yypact_value_is_default (yyn))
    goto yydefault;

  /* Not known => get a lookahead token if don't already have one.  */

  /* YYCHAR is either empty, or end-of-input, or a valid lookahead.  */
  if (yychar == YYEMPTY)
    {
      YYDPRINTF ((stderr, "Reading a token\n"));
      yychar = yylex ();
    }

  if (yychar <= YYEOF)
    {
      yychar = YYEOF;
      yytoken = YYSYMBOL_YYEOF;
      YYDPRINTF ((stderr, "Now at end of input.\n"));
    }
  else if (yychar == YYerror)
    {
      /* The scanner already issued an error message, process directly
         to error recovery.  But do not keep the error token as
         lookahead, it is too special and may lead us to an endless
         loop in error recovery. */
      yychar = YYUNDEF;
      yytoken = YYSYMBOL_YYerror;
      yyerror_range[1] = yylloc;
      goto yyerrlab1;
    }
  else
    {
      yytoken = YYTRANSLATE (yychar);
      YY_SYMBOL_PRINT ("Next token is", yytoken, &yylval, &yylloc);
    }

  /* If the proper action on seeing token YYTOKEN is to reduce or to
     detect an error, take that action.  */
  yyn += yytoken;
  if (yyn < 0 || YYLAST < yyn || yycheck[yyn] != yytoken)
    goto yydefault;
  yyn = yytable[yyn];
  if (yyn <= 0)
    {
      if (yytable_value_is_error (yyn))
        goto yyerrlab;
      yyn = -yyn;
      goto yyreduce;
    }

  /* Count tokens shifted since error; after three, turn off error
     status.  */
  if (yyerrstatus)
    yyerrstatus--;

  /* Shift the lookahead token.  */
  YY_SYMBOL_PRINT ("Shifting", yytoken, &yylval, &yylloc);
  yystate = yyn;
  YY_IGNORE_MAYBE_UNINITIALIZED_BEGIN
  *++yyvsp = yylval;
  YY_IGNORE_MAYBE_UNINITIALIZED_END
  *++yylsp = yylloc;

  /* Discard the shifted token.  */
  yychar = YYEMPTY;
  goto yynewstate;


/*-----------------------------------------------------------.
| yydefault -- do the default action for the current state.  |
`-----------------------------------------------------------*/
yydefault:
  yyn = yydefact[yystate];
  if (yyn == 0)
    goto yyerrlab;
  goto yyreduce;


/*-----------------------------.
| yyreduce -- do a reduction.  |
`-----------------------------*/
yyreduce:
  /* yyn is the number of a rule to reduce with.  */
  yylen = yyr2[yyn];

  /* If YYLEN is nonzero, implement the default value of the action:
     '$$ = $1'.

     Otherwise, the following line sets YYVAL to garbage.
     This behavior is undocumented and Bison
     users should not rely upon it.  Assigning to YYVAL
     unconditionally makes the parser a bit smaller, and it avoids a
     GCC warning that YYVAL may be used uninitialized.  */
  yyval = yyvsp[1-yylen];

  /* Default location. */
  YYLLOC_DEFAULT (yyloc, (yylsp - yylen), yylen);
  yyerror_range[1] = yyloc;
  YY_REDUCE_PRINT (yyn);
  switch (yyn)
    {
  case 2: /* Program: MainClass ClassDeclarationList  */
#line 124 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                       { 
		*program = (yyval.Program) = new CProgram( (yyvsp[-1].MainClass), (yyvsp[0].ClassDeclarationList) );
	}
#line 1649 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 3: /* MainClass: CLASS Identifier LBRACE MainMethod RBRACE  */
#line 133 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
        {	
		(yyval.MainClass) = new CMainClass( (yyvsp[-3].Identifier), (yyvsp[-1].MainMethod) );
	}
#line 1657 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 4: /* MainMethod: PUBLIC STATIC VOID MAIN LPAREN STRING LBRACKET RBRACKET Identifier RPAREN LBRACE VarDeclarationList StatementList RBRACE  */
#line 144 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
        {	
		(yyval.MainMethod) = new CMainMethod( 0, (yyvsp[-5].Identifier), (CFieldList *) (yyvsp[-2].VarDeclarationList),(CCompoundStm *)(yyvsp[-1].Statement) );
	}
#line 1665 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 5: /* ClassDeclarationList: %empty  */
#line 150 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
               { 
		(yyval.ClassDeclarationList) = new CClassList();
	}
#line 1673 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 6: /* ClassDeclarationList: ClassDeclarationList Class  */
#line 154 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                   { (yyval.ClassDeclarationList) = (yyvsp[-1].ClassDeclarationList); (yyvsp[-1].ClassDeclarationList)->Add((yyvsp[0].Class)); }
#line 1679 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 7: /* Class: CLASS Identifier LBRACE VarDeclarationList MethodDeclarationList RBRACE  */
#line 161 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
               { 
		(yyval.Class) = new CClass( (yyvsp[-4].Identifier), 0, (yyvsp[-2].VarDeclarationList), (yyvsp[-1].MethodDeclarationList) );
	}
#line 1687 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 8: /* Class: CLASS Identifier EXTENDS Identifier LBRACE VarDeclarationList MethodDeclarationList RBRACE  */
#line 168 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
               { 
		(yyval.Class) = new CClass( (yyvsp[-6].Identifier), (yyvsp[-4].Identifier), (yyvsp[-2].VarDeclarationList), (yyvsp[-1].MethodDeclarationList) );
	}
#line 1695 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 9: /* MethodDeclaration: PUBLIC Type Identifier LPAREN ArgumentList RPAREN LBRACE VarDeclarationList StatementList RETURN Expression SEMI RBRACE  */
#line 180 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
        { 
		(yyval.MethodDeclaration) = new CMethod( (yyvsp[-11].Type), (yyvsp[-2].Expression), (yyvsp[-10].Identifier), (yyvsp[-8].ArgumentList), (CFieldList *)(yyvsp[-5].VarDeclarationList),(CCompoundStm *)(yyvsp[-4].Statement), true );
	}
#line 1703 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 10: /* MethodDeclaration: PRIVATE Type Identifier LPAREN ArgumentList RPAREN LBRACE VarDeclarationList StatementList RETURN Expression SEMI RBRACE  */
#line 190 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
        { 
		(yyval.MethodDeclaration) = new CMethod( (yyvsp[-11].Type), (yyvsp[-2].Expression), (yyvsp[-10].Identifier), (yyvsp[-8].ArgumentList), (CFieldList *)(yyvsp[-5].VarDeclarationList), (CCompoundStm *)(yyvsp[-4].Statement), false );
	}
#line 1711 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 11: /* MethodDeclarationList: %empty  */
#line 196 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
               { 
		(yyval.MethodDeclarationList) = new CMethodList();
	}
#line 1719 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 12: /* MethodDeclarationList: MethodDeclarationList MethodDeclaration  */
#line 200 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                                { 
		(yyval.MethodDeclarationList) = (yyvsp[-1].MethodDeclarationList); (yyvsp[-1].MethodDeclarationList)->Add((yyvsp[0].MethodDeclaration));
	}
#line 1727 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 13: /* VarDeclaration: Type Identifier SEMI  */
#line 206 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                             {
	    (yyvsp[-1].Identifier)->isInstance = true;
		(yyval.VarDeclaration) = new CField( (yyvsp[-2].Type), (yyvsp[-1].Identifier) );
	}
#line 1736 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 14: /* VarDeclarationList: %empty  */
#line 213 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
               { 
		(yyval.VarDeclarationList) = new CFieldList();
	}
#line 1744 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 15: /* VarDeclarationList: VarDeclarationList VarDeclaration  */
#line 217 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                          {
		(yyval.VarDeclarationList) = (yyvsp[-1].VarDeclarationList); (yyvsp[-1].VarDeclarationList)->Add( (yyvsp[0].VarDeclaration) );
	}
#line 1752 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 16: /* Argument: Type Identifier  */
#line 223 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                        {
	    (yyvsp[0].Identifier)->isInstance = true;
		(yyval.Argument) = new CArgument( (yyvsp[-1].Type), (yyvsp[0].Identifier) );
	}
#line 1761 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 17: /* Type: INT_ARRAY  */
#line 230 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                  { 
		auto p = (yyval.Type) = new CType( enums::TPrimitiveType::INT_ARRAY );
		SAVE_LOCATION
	}
#line 1770 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 18: /* Type: BOOLEAN  */
#line 235 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                { 
	    auto p = (yyval.Type) = new CType( enums::TPrimitiveType::BOOLEAN );
		SAVE_LOCATION
	}
#line 1779 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 19: /* Type: INT  */
#line 240 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
            { 
		auto p = (yyval.Type) = new CType( enums::TPrimitiveType::INT );
		SAVE_LOCATION
	}
#line 1788 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 20: /* Type: Identifier  */
#line 245 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                   { (yyval.Type) = new CType( (yyvsp[0].Identifier) ); }
#line 1794 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 21: /* NonEmptyArgumentList: Argument  */
#line 248 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                 { (yyval.NonEmptyArgumentList) = new CArgumentList((yyvsp[0].Argument)); }
#line 1800 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 22: /* NonEmptyArgumentList: NonEmptyArgumentList COMMA Argument  */
#line 250 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                            { (yyval.NonEmptyArgumentList) = (yyvsp[-2].NonEmptyArgumentList); (yyvsp[-2].NonEmptyArgumentList)->Add((yyvsp[0].Argument)); }
#line 1806 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 23: /* ArgumentList: %empty  */
#line 254 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
               { (yyval.ArgumentList) = new CArgumentList(); }
#line 1812 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 24: /* ArgumentList: NonEmptyArgumentList  */
#line 256 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                             { (yyval.ArgumentList) = (yyvsp[0].NonEmptyArgumentList); }
#line 1818 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 25: /* StatementList: %empty  */
#line 260 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
               {(yyval.Statement) = new CCompoundStm( 0, 0 ); }
#line 1824 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 26: /* StatementList: Statement StatementList  */
#line 262 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                { (yyval.Statement) = new CCompoundStm((yyvsp[-1].Statement), (yyvsp[0].Statement));  }
#line 1830 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 27: /* Statement: LBRACE StatementList RBRACE  */
#line 266 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                    { (yyval.Statement) = (yyvsp[-1].Statement); }
#line 1836 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 28: /* Statement: IF LPAREN Expression RPAREN Statement ELSE Statement  */
#line 268 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                                             { (yyval.Statement) = new CIfStm( (yyvsp[-4].Expression), (yyvsp[-2].Statement), (yyvsp[0].Statement) );  }
#line 1842 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 29: /* Statement: WHILE LPAREN Expression RPAREN Statement  */
#line 270 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                                 { (yyval.Statement) = new CWhileStm( (yyvsp[-2].Expression), (yyvsp[0].Statement) );  }
#line 1848 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 30: /* Statement: PRINTLN LPAREN Expression RPAREN SEMI  */
#line 272 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                              { (yyval.Statement) = new CPrintStm( (yyvsp[-2].Expression) ); }
#line 1854 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 31: /* Statement: Identifier ASSIGN Expression SEMI  */
#line 274 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                          { (yyvsp[-3].Identifier)->isInstance = true; (yyval.Statement) = new CAssignStm( (yyvsp[-3].Identifier), (yyvsp[-1].Expression) );  }
#line 1860 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 32: /* Statement: Identifier LBRACKET Expression RBRACKET ASSIGN Expression SEMI  */
#line 276 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                                                       { (yyvsp[-6].Identifier)->isInstance = true; (yyval.Statement) = new CAssignSubscriptStm( (yyvsp[-6].Identifier), (yyvsp[-4].Expression), (yyvsp[-1].Expression) );  }
#line 1866 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 33: /* Expression: Expression PLUS Expression  */
#line 280 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                   { (yyval.Expression) = new COpExp( (yyvsp[-2].Expression), (yyvsp[0].Expression), enums::TOperation::PLUS );  }
#line 1872 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 34: /* Expression: Expression MINUS Expression  */
#line 282 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                    { (yyval.Expression) = new COpExp( (yyvsp[-2].Expression), (yyvsp[0].Expression), enums::TOperation::MINUS );  }
#line 1878 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 35: /* Expression: Expression TIMES Expression  */
#line 284 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                    { (yyval.Expression) = new COpExp( (yyvsp[-2].Expression), (yyvsp[0].Expression), enums::TOperation::MULTIPLY );  }
#line 1884 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 36: /* Expression: Expression AND Expression  */
#line 286 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                  { (yyval.Expression) = new CLogOpExp( (yyvsp[-2].Expression), (yyvsp[0].Expression), enums::TLogicalOperation::AND );  }
#line 1890 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 37: /* Expression: Expression OR Expression  */
#line 288 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                 { (yyval.Expression) = new CLogOpExp( (yyvsp[-2].Expression), (yyvsp[0].Expression), enums::TLogicalOperation::OR );  }
#line 1896 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 38: /* Expression: Expression LESS Expression  */
#line 290 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                   { (yyval.Expression) = new CCompExp( (yyvsp[-2].Expression), (yyvsp[0].Expression), enums::TCompareOperation::LESS );  }
#line 1902 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 39: /* Expression: Expression GREATER Expression  */
#line 292 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                      { (yyval.Expression) = new CCompExp( (yyvsp[-2].Expression), (yyvsp[0].Expression), enums::TCompareOperation::GREATER );  }
#line 1908 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 40: /* Expression: Expression MOD Expression  */
#line 294 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                  { (yyval.Expression) = new COpExp( (yyvsp[-2].Expression), (yyvsp[0].Expression), enums::TOperation::MOD );  }
#line 1914 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 41: /* Expression: Expression LBRACKET Expression RBRACKET  */
#line 296 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                                { (yyval.Expression) = new CByIndexExpression((yyvsp[-3].Expression), (yyvsp[-1].Expression));  }
#line 1920 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 42: /* Expression: Expression DOT LENGTH  */
#line 298 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                              { (yyval.Expression) = new CGetLengthExp( (yyvsp[-2].Expression) );  }
#line 1926 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 43: /* Expression: Expression DOT Identifier LPAREN ExpressionList RPAREN  */
#line 300 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                                               { (yyval.Expression) = new CCallMethodExp( (yyvsp[-5].Expression), (yyvsp[-3].Identifier), (CExpList*) (yyvsp[-1].ExpressionList)) ;  }
#line 1932 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 44: /* Expression: Expression DOT Identifier  */
#line 302 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                  { (yyvsp[0].Identifier)->isInstance = true; (yyval.Expression) = new CGetFieldByThisExpression( (yyvsp[0].Identifier) ); }
#line 1938 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 45: /* Expression: MINUS Expression  */
#line 304 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                         { (yyval.Expression) = new CUnarMinusExp( (yyvsp[0].Expression) ); }
#line 1944 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 46: /* Expression: NUM  */
#line 306 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
            { auto p = (yyval.Expression) = new CNumExp((yyvsp[0].string)); SAVE_LOCATION }
#line 1950 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 47: /* Expression: TRUE  */
#line 308 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
             { auto p = (yyval.Expression) = new CLogExp(true); SAVE_LOCATION }
#line 1956 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 48: /* Expression: FALSE  */
#line 310 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
              { auto p = (yyval.Expression) = new CLogExp(false); SAVE_LOCATION }
#line 1962 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 49: /* Expression: Identifier  */
#line 312 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                   { (yyvsp[0].Identifier)->isInstance = true; (yyval.Expression) = (yyvsp[0].Identifier); }
#line 1968 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 50: /* Expression: NEW INT LBRACKET Expression RBRACKET  */
#line 314 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                             { (yyval.Expression) = new CNewArrayExpression((yyvsp[-1].Expression));  }
#line 1974 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 51: /* Expression: NEW Identifier LPAREN RPAREN  */
#line 316 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                      { (yyval.Expression) = new CNewIdentifier( (yyvsp[-2].Identifier) );  }
#line 1980 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 52: /* Expression: LPAREN Expression RPAREN  */
#line 318 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                 { (yyval.Expression) = (yyvsp[-1].Expression); }
#line 1986 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 53: /* Expression: THIS  */
#line 320 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
             { auto p = (yyval.Expression) = new CThisExpression(); SAVE_LOCATION }
#line 1992 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 54: /* Expression: NOT Expression  */
#line 322 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                       { (yyval.Expression) = new CNegativeExpression((yyvsp[0].Expression));  }
#line 1998 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 55: /* NonEmptyExpressionList: Expression  */
#line 326 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                   { (yyval.NonEmptyExpressionList) = new CExpList((yyvsp[0].Expression));  }
#line 2004 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 56: /* NonEmptyExpressionList: NonEmptyExpressionList COMMA Expression  */
#line 328 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                                { (yyval.NonEmptyExpressionList) = (yyvsp[-2].NonEmptyExpressionList); (yyvsp[-2].NonEmptyExpressionList)->Add((yyvsp[0].Expression)); }
#line 2010 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 57: /* ExpressionList: %empty  */
#line 332 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
               { (yyval.ExpressionList) = new CExpList();  }
#line 2016 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 58: /* ExpressionList: NonEmptyExpressionList  */
#line 334 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                               { (yyval.ExpressionList) = (yyvsp[0].NonEmptyExpressionList); }
#line 2022 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 59: /* Identifier: ID  */
#line 338 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
           { auto p = (yyval.Identifier) = new CIdExp( (yyvsp[0].string) ); SAVE_LOCATION }
#line 2028 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;


#line 2032 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"

      default: break;
    }
  /* User semantic actions sometimes alter yychar, and that requires
     that yytoken be updated with the new translation.  We take the
     approach of translating immediately before every use of yytoken.
     One alternative is translating here after every semantic action,
     but that translation would be missed if the semantic action invokes
     YYABORT, YYACCEPT, or YYERROR immediately after altering yychar or
     if it invokes YYBACKUP.  In the case of YYABORT or YYACCEPT, an
     incorrect destructor might then be invoked immediately.  In the
     case of YYERROR or YYBACKUP, subsequent parser actions might lead
     to an incorrect destructor call or verbose syntax error message
     before the lookahead is translated.  */
  YY_SYMBOL_PRINT ("-> $$ =", YY_CAST (yysymbol_kind_t, yyr1[yyn]), &yyval, &yyloc);

  YYPOPSTACK (yylen);
  yylen = 0;

  *++yyvsp = yyval;
  *++yylsp = yyloc;

  /* Now 'shift' the result of the reduction.  Determine what state
     that goes to, based on the state we popped back to and the rule
     number reduced by.  */
  {
    const int yylhs = yyr1[yyn] - YYNTOKENS;
    const int yyi = yypgoto[yylhs] + *yyssp;
    yystate = (0 <= yyi && yyi <= YYLAST && yycheck[yyi] == *yyssp
               ? yytable[yyi]
               : yydefgoto[yylhs]);
  }

  goto yynewstate;


/*--------------------------------------.
| yyerrlab -- here on detecting error.  |
`--------------------------------------*/
yyerrlab:
  /* Make sure we have latest lookahead translation.  See comments at
     user semantic actions for why this is necessary.  */
  yytoken = yychar == YYEMPTY ? YYSYMBOL_YYEMPTY : YYTRANSLATE (yychar);
  /* If not already recovering from an error, report this error.  */
  if (!yyerrstatus)
    {
      ++yynerrs;
      {
        yypcontext_t yyctx
          = {yyssp, yytoken, &yylloc};
        char const *yymsgp = YY_("syntax error");
        int yysyntax_error_status;
        yysyntax_error_status = yysyntax_error (&yymsg_alloc, &yymsg, &yyctx);
        if (yysyntax_error_status == 0)
          yymsgp = yymsg;
        else if (yysyntax_error_status == -1)
          {
            if (yymsg != yymsgbuf)
              YYSTACK_FREE (yymsg);
            yymsg = YY_CAST (char *,
                             YYSTACK_ALLOC (YY_CAST (YYSIZE_T, yymsg_alloc)));
            if (yymsg)
              {
                yysyntax_error_status
                  = yysyntax_error (&yymsg_alloc, &yymsg, &yyctx);
                yymsgp = yymsg;
              }
            else
              {
                yymsg = yymsgbuf;
                yymsg_alloc = sizeof yymsgbuf;
                yysyntax_error_status = YYENOMEM;
              }
          }
        yyerror (program, yymsgp);
        if (yysyntax_error_status == YYENOMEM)
          YYNOMEM;
      }
    }

  yyerror_range[1] = yylloc;
  if (yyerrstatus == 3)
    {
      /* If just tried and failed to reuse lookahead token after an
         error, discard it.  */

      if (yychar <= YYEOF)
        {
          /* Return failure if at end of input.  */
          if (yychar == YYEOF)
            YYABORT;
        }
      else
        {
          yydestruct ("Error: discarding",
                      yytoken, &yylval, &yylloc, program);
          yychar = YYEMPTY;
        }
    }

  /* Else will try to reuse lookahead token after shifting the error
     token.  */
  goto yyerrlab1;


/*---------------------------------------------------.
| yyerrorlab -- error raised explicitly by YYERROR.  |
`---------------------------------------------------*/
yyerrorlab:
  /* Pacify compilers when the user code never invokes YYERROR and the
     label yyerrorlab therefore never appears in user code.  */
  if (0)
    YYERROR;
  ++yynerrs;

  /* Do not reclaim the symbols of the rule whose action triggered
     this YYERROR.  */
  YYPOPSTACK (yylen);
  yylen = 0;
  YY_STACK_PRINT (yyss, yyssp);
  yystate = *yyssp;
  goto yyerrlab1;


/*-------------------------------------------------------------.
| yyerrlab1 -- common code for both syntax error and YYERROR.  |
`-------------------------------------------------------------*/
yyerrlab1:
  yyerrstatus = 3;      /* Each real token shifted decrements this.  */

  /* Pop stack until we find a state that shifts the error token.  */
  for (;;)
    {
      yyn = yypact[yystate];
      if (!yypact_value_is_default (yyn))
        {
          yyn += YYSYMBOL_YYerror;
          if (0 <= yyn && yyn <= YYLAST && yycheck[yyn] == YYSYMBOL_YYerror)
            {
              yyn = yytable[yyn];
              if (0 < yyn)
                break;
            }
        }

      /* Pop the current state because it cannot handle the error token.  */
      if (yyssp == yyss)
        YYABORT;

      yyerror_range[1] = *yylsp;
      yydestruct ("Error: popping",
                  YY_ACCESSING_SYMBOL (yystate), yyvsp, yylsp, program);
      YYPOPSTACK (1);
      yystate = *yyssp;
      YY_STACK_PRINT (yyss, yyssp);
    }

  YY_IGNORE_MAYBE_UNINITIALIZED_BEGIN
  *++yyvsp = yylval;
  YY_IGNORE_MAYBE_UNINITIALIZED_END

  yyerror_range[2] = yylloc;
  ++yylsp;
  YYLLOC_DEFAULT (*yylsp, yyerror_range, 2);

  /* Shift the error token.  */
  YY_SYMBOL_PRINT ("Shifting", YY_ACCESSING_SYMBOL (yyn), yyvsp, yylsp);

  yystate = yyn;
  goto yynewstate;


/*-------------------------------------.
| yyacceptlab -- YYACCEPT comes here.  |
`-------------------------------------*/
yyacceptlab:
  yyresult = 0;
  goto yyreturnlab;


/*-----------------------------------.
| yyabortlab -- YYABORT comes here.  |
`-----------------------------------*/
yyabortlab:
  yyresult = 1;
  goto yyreturnlab;


/*-----------------------------------------------------------.
| yyexhaustedlab -- YYNOMEM (memory exhaustion) comes here.  |
`-----------------------------------------------------------*/
yyexhaustedlab:
  yyerror (program, YY_("memory exhausted"));
  yyresult = 2;
  goto yyreturnlab;


/*----------------------------------------------------------.
| yyreturnlab -- parsing is finished, clean up and return.  |
`----------------------------------------------------------*/
yyreturnlab:
  if (yychar != YYEMPTY)
    {
      /* Make sure we have latest lookahead translation.  See comments at
         user semantic actions for why this is necessary.  */
      yytoken = YYTRANSLATE (yychar);
      yydestruct ("Cleanup: discarding lookahead",
                  yytoken, &yylval, &yylloc, program);
    }
  /* Do not reclaim the symbols of the rule whose action triggered
     this YYABORT or YYACCEPT.  */
  YYPOPSTACK (yylen);
  YY_STACK_PRINT (yyss, yyssp);
  while (yyssp != yyss)
    {
      yydestruct ("Cleanup: popping",
                  YY_ACCESSING_SYMBOL (+*yyssp), yyvsp, yylsp, program);
      YYPOPSTACK (1);
    }
#ifndef yyoverflow
  if (yyss != yyssa)
    YYSTACK_FREE (yyss);
#endif
  if (yymsg != yymsgbuf)
    YYSTACK_FREE (yymsg);
  return yyresult;
}